

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

char * nng_stat_desc(nng_stat *stat)

{
  nng_stat *stat_local;
  
  return stat->s_info->si_desc;
}

Assistant:

const char *
nng_stat_desc(const nng_stat *stat)
{
#if NNG_ENABLE_STATS
	return (stat->s_info->si_desc);
#else
	NNI_ARG_UNUSED(stat);
	return ("");
#endif
}